

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

void __thiscall
wasm::ShellExternalInterface::store8
          (ShellExternalInterface *this,Address addr,int8_t value,Name memoryName)

{
  bool bVar1;
  pointer ppVar2;
  address64_t address;
  Memory *memory;
  _Self local_38;
  iterator it;
  int8_t value_local;
  ShellExternalInterface *this_local;
  Name memoryName_local;
  Address addr_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  this_local = memoryName.super_IString.str._M_len;
  it._M_node._7_1_ = value;
  memoryName_local.super_IString.str._M_str = (char *)addr.addr;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
       ::find(&this->memories,(key_type *)&this_local);
  memory = (Memory *)
           std::
           map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
           ::end(&this->memories);
  bVar1 = std::operator!=(&local_38,(_Self *)&memory);
  if (!bVar1) {
    __assert_fail("it != memories.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/shell-interface.h"
                  ,0xff,"virtual void wasm::ShellExternalInterface::store8(Address, int8_t, Name)");
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>::
           operator->(&local_38);
  address = Address::operator_cast_to_unsigned_long
                      ((Address *)&memoryName_local.super_IString.str._M_str);
  Memory::set<signed_char>(&ppVar2->second,address,it._M_node._7_1_);
  return;
}

Assistant:

void store8(Address addr, int8_t value, Name memoryName) override {
    auto it = memories.find(memoryName);
    assert(it != memories.end());
    auto& memory = it->second;
    memory.set<int8_t>(addr, value);
  }